

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::strings_internal::AppendPieces
          (strings_internal *this,Nonnull<std::string_*> dest,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces)

{
  ulong uVar1;
  long lVar2;
  size_t __n;
  long lVar3;
  long lVar4;
  iterator pbVar5;
  void *__dest;
  size_t this_size;
  
  pbVar5 = pieces._M_array;
  uVar1 = *(ulong *)(this + 8);
  if (pbVar5 == (iterator)0x0) {
    std::__cxx11::string::_M_replace_aux((ulong)this,uVar1,0,'\0');
    lVar3 = *(long *)this;
    __dest = (void *)(uVar1 + lVar3);
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar2 = *(long *)((long)&(dest->_M_dataplus)._M_p + lVar3);
      if ((lVar2 != 0) &&
         ((ulong)(*(long *)((long)&dest->_M_string_length + lVar3) - *(long *)this) <= uVar1)) {
        __assert_fail("((piece).size() == 0) || (uintptr_t((piece).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/str_cat.cc"
                      ,0xa7,
                      "void absl::strings_internal::AppendPieces(absl::Nonnull<std::string *>, std::initializer_list<absl::string_view>)"
                     );
      }
      lVar4 = lVar4 + lVar2;
      lVar3 = lVar3 + 0x10;
    } while ((long)pbVar5 << 4 != lVar3);
    std::__cxx11::string::_M_replace_aux((ulong)this,uVar1,0,(char)lVar4);
    lVar3 = *(long *)this;
    __dest = (void *)(uVar1 + lVar3);
    if (pbVar5 != (iterator)0x0) {
      lVar4 = 0;
      do {
        __n = *(size_t *)((long)&(dest->_M_dataplus)._M_p + lVar4);
        if (__n != 0) {
          memcpy(__dest,*(void **)((long)&dest->_M_string_length + lVar4),__n);
          __dest = (void *)((long)__dest + __n);
        }
        lVar4 = lVar4 + 0x10;
      } while ((long)pbVar5 << 4 != lVar4);
    }
  }
  if (__dest != (void *)(lVar3 + *(long *)(this + 8))) {
    __assert_fail("out == begin + dest->size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/str_cat.cc"
                  ,0xb5,
                  "void absl::strings_internal::AppendPieces(absl::Nonnull<std::string *>, std::initializer_list<absl::string_view>)"
                 );
  }
  return;
}

Assistant:

void AppendPieces(absl::Nonnull<std::string*> dest,
                  std::initializer_list<absl::string_view> pieces) {
  size_t old_size = dest->size();
  size_t to_append = 0;
  for (absl::string_view piece : pieces) {
    ASSERT_NO_OVERLAP(*dest, piece);
    to_append += piece.size();
  }
  STLStringAppendUninitializedAmortized(dest, to_append);

  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  for (absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    if (this_size != 0) {
      memcpy(out, piece.data(), this_size);
      out += this_size;
    }
  }
  assert(out == begin + dest->size());
}